

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void * sexp_alloc(sexp_conflict ctx,size_t size)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong chunk_size;
  sexp_conflict ctx_00;
  sexp_conflict psVar3;
  ulong size_00;
  size_t sVar4;
  long lVar5;
  long in_RSI;
  size_t in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  sexp_heap_conflict h;
  size_t total_size;
  size_t sum_freed;
  size_t max_freed;
  void *res;
  size_t *in_stack_000000f8;
  sexp_conflict in_stack_00000100;
  ulong local_28;
  size_t in_stack_ffffffffffffffe0;
  sexp_conflict in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_RDI + 0x70);
  chunk_size = in_RSI + 0x1fU & 0xffffffffffffffe0;
  ctx_00 = (sexp_conflict)sexp_try_alloc(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (ctx_00 == (sexp_conflict)0x0) {
    psVar3 = sexp_gc(in_stack_00000100,in_stack_000000f8);
    auVar2._8_8_ = (long)psVar3 >> 0x3f;
    auVar2._0_8_ = (ulong)psVar3 & 0xfffffffffffffffe;
    size_00 = SUB168(auVar2 / SEXT816(2),0);
    sVar4 = sexp_heap_total_size(*(sexp_heap_conflict *)(in_RDI + 0x70));
    if (((size_00 < chunk_size) ||
        ((local_28 < sVar4 &&
         (lVar5 = sVar4 - local_28, auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20), auVar6._0_8_ = lVar5
         , auVar6._12_4_ = 0x45300000, auVar7._8_4_ = (int)(sVar4 >> 0x20), auVar7._0_8_ = sVar4,
         auVar7._12_4_ = 0x45300000,
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 0.75 <
         (auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0))))) &&
       ((*(long *)(lVar1 + 8) == 0 || (sVar4 < *(ulong *)(lVar1 + 8))))) {
      sexp_grow_heap((sexp_conflict)h,in_RDI,chunk_size);
    }
    ctx_00 = (sexp_conflict)sexp_try_alloc(ctx_00,size_00);
    if (ctx_00 == (sexp_conflict)0x0) {
      ctx_00 = *(sexp_conflict *)(*(long *)(in_RDI + 0x28) + 0x38);
    }
  }
  return ctx_00;
}

Assistant:

void* sexp_alloc (sexp ctx, size_t size) {
  void *res;
  size_t max_freed, sum_freed, total_size=0;
  sexp_heap h = sexp_context_heap(ctx);
#if SEXP_USE_TRACK_ALLOC_SIZES
  size_t size_bucket;
#endif
#if SEXP_USE_TRACK_ALLOC_TIMES
  sexp_uint_t alloc_time;
  struct timeval start, end;
  gettimeofday(&start, NULL);
#endif
  size = sexp_heap_align(size) + SEXP_GC_PAD;
#if SEXP_USE_TRACK_ALLOC_SIZES
  size_bucket = (size - SEXP_GC_PAD) / sexp_heap_align(1) - 1;
  ++sexp_context_alloc_histogram(ctx)[size_bucket >= SEXP_ALLOC_HISTOGRAM_BUCKETS ? SEXP_ALLOC_HISTOGRAM_BUCKETS-1 : size_bucket];
#endif
  res = sexp_try_alloc(ctx, size);
  if (! res) {
    max_freed = sexp_unbox_fixnum(sexp_gc(ctx, &sum_freed));
#if SEXP_USE_FIXED_CHUNK_SIZE_HEAPS
    sexp_find_fixed_chunk_heap_usage(ctx, size, &sum_freed, &total_size);
#else
    total_size = sexp_heap_total_size(sexp_context_heap(ctx));
#endif
    if (((max_freed < size)
         || ((total_size > sum_freed)
             && (total_size - sum_freed) > (total_size*SEXP_GROW_HEAP_RATIO)))
        && ((!h->max_size) || (total_size < h->max_size)))
      sexp_grow_heap(ctx, size, 0);
    res = sexp_try_alloc(ctx, size);
    if (! res) {
      res = sexp_global(ctx, SEXP_G_OOM_ERROR);
      sexp_debug_printf("ran out of memory allocating %lu bytes => %p", size, res);
    }
  }
#if SEXP_USE_TRACK_ALLOC_TIMES
  gettimeofday(&end, NULL);
  alloc_time = 1000000*(end.tv_sec - start.tv_sec) + (end.tv_usec - start.tv_usec);
  sexp_context_alloc_count(ctx) += 1;
  sexp_context_alloc_usecs(ctx) += alloc_time;
  sexp_context_alloc_usecs_sq(ctx) += alloc_time*alloc_time;
#endif
  return res;
}